

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PFileSender.cpp
# Opt level: O3

void __thiscall P2PFileSenderConnection::OnTick(P2PFileSenderConnection *this,uint64_t nowUsec)

{
  ostringstream *poVar1;
  TonkFile pTVar2;
  uint64_t uVar3;
  char *__s;
  undefined1 auVar4 [16];
  size_t sVar5;
  OutputWorker *pOVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 local_228 [392];
  TonkStatusEx local_a0;
  undefined1 auVar8 [16];
  
  auVar7 = in_ZMM0._0_16_;
  if (this->File == (TonkFile)0x0) {
    return;
  }
  tonk_file_send(this->File);
  pTVar2 = this->File;
  if ((pTVar2->Flags & 1) == 0) {
    if (nowUsec - this->LastReportUsec < 0xf4241) {
      return;
    }
    this->LastReportUsec = nowUsec;
    auVar7 = vcvtusi2ss_avx512f(auVar7,pTVar2->TotalBytes);
    uVar3 = pTVar2->ProgressBytes;
    tonk::SDKConnection::GetStatusEx(&local_a0,&this->super_SDKConnection);
    if (2 < (int)Logger.ChannelMinLevel) {
      return;
    }
    auVar4 = vcvtusi2sd_avx512f(in_XMM1,local_a0.PeerSeenBPS);
    poVar1 = (ostringstream *)(local_228 + 0x10);
    local_228._0_8_ = Logger.ChannelName;
    local_228._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    auVar8._8_8_ = extraout_XMM1_Qb;
    auVar8._0_8_ = extraout_XMM1_Qa;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File(",5);
    __s = pTVar2->Name;
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_228._16_8_ + -0x18));
      auVar8._8_8_ = extraout_XMM1_Qb_00;
      auVar8._0_8_ = extraout_XMM1_Qa_00;
    }
    else {
      sVar5 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") progress: ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," Bytes (",8);
    auVar8 = vcvtusi2ss_avx512f(auVar8,uVar3 * 100);
    std::ostream::_M_insert<double>((double)(auVar8._0_4_ / auVar7._0_4_));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"%).  Received by peer at ",0x19);
    std::ostream::_M_insert<double>(auVar4._0_8_ / 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," KBPS",5);
    pOVar6 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_228);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_228 + 0x80));
    return;
  }
  if ((pTVar2->Flags & 2) == 0) {
    if (2 < (int)Logger.ChannelMinLevel) goto LAB_00103c74;
    poVar1 = (ostringstream *)(local_228 + 0x10);
    local_228._0_8_ = Logger.ChannelName;
    local_228._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"File transfer completed",0x17);
    pOVar6 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_228);
  }
  else {
    if (4 < (int)Logger.ChannelMinLevel) goto LAB_00103c74;
    poVar1 = (ostringstream *)(local_228 + 0x10);
    local_228._0_8_ = Logger.ChannelName;
    local_228._8_4_ = Error;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"File transfer failed",0x14);
    pOVar6 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_228);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_228 + 0x10));
  std::ios_base::~ios_base((ios_base *)(local_228 + 0x80));
LAB_00103c74:
  tonk_file_free(this->File);
  this->File = (TonkFile)0x0;
  return;
}

Assistant:

void P2PFileSenderConnection::OnTick(
    uint64_t          nowUsec   // Current timestamp in microseconds
)
{
    if (File)
    {
        tonk_file_send(File);

        // If transfer is done we need to call tonk_file_free().
        if (File->Flags & TonkFileFlags_Done)
        {
            if (File->Flags & TonkFileFlags_Failed) {
                Logger.Error("File transfer failed");
            }
            else {
                Logger.Info("File transfer completed");
            }

            tonk_file_free(File);
            File = nullptr;

            // Start sending the next file
            //StartSending();
        }

        // Periodically report progress
        if (File && nowUsec - LastReportUsec > 1000000)
        {
            LastReportUsec = nowUsec;

            Logger.Info("File(", File->Name, ") progress: ", File->ProgressBytes, " / ", File->TotalBytes,
                " Bytes (", File->ProgressBytes * 100 / (float)File->TotalBytes,
                "%).  Received by peer at ", GetStatusEx().PeerSeenBPS / 1000.0, " KBPS");
        }
    }
}